

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

void __thiscall
ON_OBSOLETE_V5_DimOrdinate::CalcKinkPoints
          (ON_OBSOLETE_V5_DimOrdinate *this,ON_2dPoint p0,ON_2dPoint p1,int direction,
          double default_offset,ON_2dPoint *k0,ON_2dPoint *k1)

{
  double *pdVar1;
  ulong uVar2;
  double dVar3;
  ON_2dPoint local_70;
  double local_60;
  double local_58;
  undefined8 uStack_50;
  ON_2dPoint local_48;
  ulong local_38;
  undefined8 uStack_30;
  
  local_70.y = p1.y;
  local_70.x = p1.x;
  local_48.y = p0.y;
  local_48.x = p0.x;
  uVar2 = -(ulong)(this->m_kink_offset_0 == -1.23432101234321e+308);
  local_38 = ~uVar2 & (ulong)this->m_kink_offset_0 | uVar2 & (ulong)default_offset;
  uStack_30 = 0;
  uVar2 = -(ulong)(this->m_kink_offset_1 == -1.23432101234321e+308);
  local_58 = (double)(~uVar2 & (ulong)this->m_kink_offset_1 | (ulong)default_offset & uVar2);
  uStack_50 = 0;
  pdVar1 = ON_2dPoint::operator[](&local_48,1 - direction);
  local_60 = *pdVar1;
  pdVar1 = ON_2dPoint::operator[](&local_70,1 - direction);
  uVar2 = -(ulong)(*pdVar1 < local_60);
  dVar3 = (double)(~uVar2 & local_38 | (local_38 ^ 0x8000000000000000) & uVar2);
  if (*pdVar1 < local_60) {
    local_58 = -local_58;
  }
  if (direction == 0) {
    k1->x = local_48.x;
    local_70.y = local_70.y - dVar3;
    k1->y = local_70.y - local_58;
    k0->x = local_70.x;
  }
  else {
    local_70.x = local_70.x - dVar3;
    k1->x = local_70.x - local_58;
    k1->y = local_48.y;
    k0->x = local_70.x;
  }
  k0->y = local_70.y;
  return;
}

Assistant:

void ON_OBSOLETE_V5_DimOrdinate::CalcKinkPoints( ON_2dPoint p0, ON_2dPoint p1, 
                                            int direction, double default_offset,
                                            ON_2dPoint& k0, ON_2dPoint& k1) const
{
  double offset0 = KinkOffset( 0);
  double offset1 = KinkOffset( 1);

  // if these haven't been set by dragging the offset points
  // use 2*textheight
  if( offset0 == ON_UNSET_VALUE)
    offset0 = default_offset;
  if( offset1 == ON_UNSET_VALUE)
    offset1 = default_offset;

  if( p0[1-direction] > p1[1-direction])
  {
    offset0 = -offset0;
    offset1 = -offset1;
  }

  //double d = fabs( p0[1-direction] - p1[1-direction]);

  if( direction == 0)
  {
    //if( d - fabs( offset0) > default_offset)
    //{
      k1.x = p0.x;
      k1.y = p1.y - offset0 - offset1;
    //}
    //else
    //{
    //  k1.x = p0.x;
    //  k1.y = p1.y + offset0 - offset1;
    //}

    k0.x = p1.x;
    k0.y = p1.y - offset0;
  }
  else
  {
    //if( d - fabs( offset0) > default_offset)
    //{
      k1.x = p1.x - offset0 - offset1;
      k1.y = p0.y;
    //}
    //else
    //{
    //  k1.x = p1.x + offset0 - offset1;
    //  k1.y = p0.y;
    //}

    k0.x = p1.x - offset0;
    k0.y = p1.y;
  }
}